

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_consumer.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::objectivec::ParseSimpleStream
          (objectivec *this,ZeroCopyInputStream *input_stream,string_view stream_name,
          LineConsumer *line_consumer,string *out_error)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  bool bVar3;
  bool bVar4;
  Nonnull<char_*> pcVar5;
  string_view chunk;
  string_view chunk_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> pieces_00;
  int buf_len;
  string local_error;
  void *buf;
  Parser parser;
  int local_154;
  string local_150;
  string *local_130;
  ZeroCopyInputStream *local_128;
  size_t local_120;
  string local_118;
  char *local_f8;
  Parser local_f0;
  long local_c0;
  Nonnull<char_*> local_b8;
  char local_b0 [32];
  undefined8 local_90;
  char *local_88;
  ZeroCopyInputStream *local_80;
  size_t local_78;
  undefined8 local_70;
  char *local_68;
  long local_60;
  Nonnull<char_*> local_58;
  undefined8 local_50;
  char *local_48;
  char *local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_f0.line_consumer_ = (LineConsumer *)stream_name._M_str;
  local_120 = stream_name._M_len;
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  local_150._M_string_length = 0;
  local_150.field_2._M_local_buf[0] = '\0';
  paVar1 = &local_f0.leftover_.field_2;
  local_f0.line_ = 0;
  local_f0.leftover_._M_string_length = 0;
  local_f0.leftover_.field_2._M_local_buf[0] = '\0';
  local_130 = (string *)line_consumer;
  local_128 = input_stream;
  local_f0.leftover_._M_dataplus._M_p = (pointer)paVar1;
  do {
    do {
      cVar2 = (**(code **)(*(long *)this + 0x10))(this,&local_f8,&local_154);
      if (cVar2 == '\0') {
        bVar3 = true;
        if (local_f0.leftover_._M_string_length == 0) goto LAB_002cd916;
        chunk_00._M_str = "\n";
        chunk_00._M_len = 1;
        bVar4 = anon_unknown_0::Parser::ParseChunk(&local_f0,chunk_00,&local_150);
        if (bVar4) {
          if (local_f0.leftover_._M_string_length == 0) goto LAB_002cd916;
          std::__cxx11::string::_M_replace
                    ((ulong)&local_150,0,(char *)local_150._M_string_length,0x5e8b2c);
        }
        pcVar5 = absl::lts_20250127::numbers_internal::FastIntToBuffer(local_f0.line_,local_b0);
        local_c0 = (long)pcVar5 - (long)local_b0;
        local_90 = 7;
        local_88 = "error: ";
        local_80 = local_128;
        local_78 = local_120;
        local_70 = 6;
        local_68 = " Line ";
        local_50 = 2;
        local_48 = ", ";
        local_40 = (char *)local_150._M_string_length;
        local_38 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_150._M_dataplus._M_p;
        pieces_00._M_len = local_150._M_string_length;
        pieces_00._M_array = (iterator)&DAT_00000006;
        local_b8 = local_b0;
        local_60 = local_c0;
        local_58 = local_b0;
        absl::lts_20250127::strings_internal::CatPieces_abi_cxx11_
                  (&local_118,(strings_internal *)&local_90,pieces_00);
        goto LAB_002cd8e8;
      }
      chunk._M_len = (size_t)local_154;
    } while (chunk._M_len == 0);
    chunk._M_str = local_f8;
    bVar3 = anon_unknown_0::Parser::ParseChunk(&local_f0,chunk,&local_150);
  } while (bVar3);
  pcVar5 = absl::lts_20250127::numbers_internal::FastIntToBuffer(local_f0.line_,local_b0);
  local_c0 = (long)pcVar5 - (long)local_b0;
  local_90 = 7;
  local_88 = "error: ";
  local_80 = local_128;
  local_78 = local_120;
  local_70 = 6;
  local_68 = " Line ";
  local_50 = 2;
  local_48 = ", ";
  local_40 = (char *)local_150._M_string_length;
  local_38 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_150._M_dataplus._M_p;
  pieces._M_len = local_150._M_string_length;
  pieces._M_array = (iterator)&DAT_00000006;
  local_b8 = local_b0;
  local_60 = local_c0;
  local_58 = local_b0;
  absl::lts_20250127::strings_internal::CatPieces_abi_cxx11_
            (&local_118,(strings_internal *)&local_90,pieces);
LAB_002cd8e8:
  std::__cxx11::string::operator=(local_130,(string *)&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  bVar3 = false;
LAB_002cd916:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.leftover_._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0.leftover_._M_dataplus._M_p,
                    CONCAT71(local_f0.leftover_.field_2._M_allocated_capacity._1_7_,
                             local_f0.leftover_.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,
                    CONCAT71(local_150.field_2._M_allocated_capacity._1_7_,
                             local_150.field_2._M_local_buf[0]) + 1);
  }
  return bVar3;
}

Assistant:

bool ParseSimpleStream(io::ZeroCopyInputStream& input_stream,
                       absl::string_view stream_name,
                       LineConsumer* line_consumer, std::string* out_error) {
  std::string local_error;
  Parser parser(line_consumer);
  const void* buf;
  int buf_len;
  while (input_stream.Next(&buf, &buf_len)) {
    if (buf_len == 0) {
      continue;
    }

    if (!parser.ParseChunk(
            absl::string_view(static_cast<const char*>(buf), (size_t)buf_len),
            &local_error)) {
      *out_error = absl::StrCat("error: ", stream_name, " Line ",
                                parser.last_line(), ", ", local_error);
      return false;
    }
  }
  if (!parser.Finish(&local_error)) {
    *out_error = absl::StrCat("error: ", stream_name, " Line ",
                              parser.last_line(), ", ", local_error);
    return false;
  }
  return true;
}